

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

QString * QUtf8::convertToUnicode(QByteArrayView in,State *state)

{
  QByteArrayView in_00;
  QChar *pQVar1;
  QChar *pQVar2;
  storage_type *in_RCX;
  __off_t __length;
  State *in_RDI;
  long in_FS_OFFSET;
  QChar *end;
  QString *result;
  Initialization in_stack_ffffffffffffff9c;
  State *state_00;
  QString *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar3;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  in_RDI->flags = (QFlagsStorageHelper<QStringConverter::Flag,_4>)0xaaaaaaaa;
  in_RDI->internalState = -0x55555556;
  in_RDI->remainingChars = -0x5555555555555556;
  in_RDI->invalidChars = -0x5555555555555556;
  state_00 = in_RDI;
  QByteArrayView::size(&local_18);
  QString::QString(in_stack_ffffffffffffffa8,(qsizetype)state_00,in_stack_ffffffffffffff9c);
  QString::data((QString *)state_00);
  in_00.m_size._7_1_ = uVar3;
  in_00.m_size._0_7_ = in_stack_ffffffffffffffc0;
  in_00.m_data = in_RCX;
  pQVar1 = convertToUnicode((QChar *)in_stack_ffffffffffffffa8,in_00,state_00);
  pQVar2 = QString::constData((QString *)0x165597);
  QString::truncate((QString *)in_RDI,(char *)((long)pQVar1 - (long)pQVar2 >> 1),__length);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)state_00;
}

Assistant:

QString QUtf8::convertToUnicode(QByteArrayView in, QStringConverter::State *state)
{
    // See above for buffer requirements for stateless decoding. However, that
    // fails if the state is not empty. The following situations can add to the
    // requirements:
    //  state contains      chars starts with           requirement
    //   1 of 2 bytes       valid continuation          0
    //   2 of 3 bytes       same                        0
    //   3 bytes of 4       same                        +1 (need to insert surrogate pair)
    //   1 of 2 bytes       invalid continuation        +1 (need to insert replacement and restart)
    //   2 of 3 bytes       same                        +1 (same)
    //   3 of 4 bytes       same                        +1 (same)
    QString result(in.size() + 1, Qt::Uninitialized);
    QChar *end = convertToUnicode(result.data(), in, state);
    result.truncate(end - result.constData());
    return result;
}